

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_decoder.h
# Opt level: O1

bool __thiscall
draco::MeshEdgebreakerTraversalDecoder::DecodeAttributeSeams(MeshEdgebreakerTraversalDecoder *this)

{
  bool bVar1;
  bool bVar2;
  long *plVar3;
  pointer __p;
  RAnsBitDecoder *pRVar4;
  long lVar5;
  long lVar6;
  RAnsBitDecoder *local_40;
  ulong local_38;
  
  lVar6 = (long)this->num_attribute_data_;
  if (0 < lVar6) {
    local_38 = lVar6 * 0x18 + 8;
    plVar3 = (long *)operator_new__(local_38);
    *plVar3 = lVar6;
    lVar5 = 0;
    pRVar4 = (RAnsBitDecoder *)(plVar3 + 1);
    do {
      RAnsBitDecoder::RAnsBitDecoder(pRVar4);
      lVar5 = lVar5 + -0x18;
      pRVar4 = pRVar4 + 1;
    } while (-lVar5 != lVar6 * 0x18);
    local_40 = (RAnsBitDecoder *)0x0;
    pRVar4 = (this->attribute_connectivity_decoders_)._M_t.
             super___uniq_ptr_impl<draco::RAnsBitDecoder,_std::default_delete<draco::RAnsBitDecoder[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_draco::RAnsBitDecoder_*,_std::default_delete<draco::RAnsBitDecoder[]>_>
             .super__Head_base<0UL,_draco::RAnsBitDecoder_*,_false>._M_head_impl;
    (this->attribute_connectivity_decoders_)._M_t.
    super___uniq_ptr_impl<draco::RAnsBitDecoder,_std::default_delete<draco::RAnsBitDecoder[]>_>._M_t
    .super__Tuple_impl<0UL,_draco::RAnsBitDecoder_*,_std::default_delete<draco::RAnsBitDecoder[]>_>.
    super__Head_base<0UL,_draco::RAnsBitDecoder_*,_false>._M_head_impl =
         (RAnsBitDecoder *)(plVar3 + 1);
    if (pRVar4 != (RAnsBitDecoder *)0x0) {
      std::default_delete<draco::RAnsBitDecoder[]>::operator()
                ((default_delete<draco::RAnsBitDecoder[]> *)&this->attribute_connectivity_decoders_,
                 pRVar4);
    }
    if (local_40 != (RAnsBitDecoder *)0x0) {
      std::default_delete<draco::RAnsBitDecoder[]>::operator()
                ((default_delete<draco::RAnsBitDecoder[]> *)&local_40,local_40);
    }
    bVar1 = 0 < this->num_attribute_data_;
    if (0 < this->num_attribute_data_) {
      bVar2 = RAnsBitDecoder::StartDecoding
                        ((this->attribute_connectivity_decoders_)._M_t.
                         super___uniq_ptr_impl<draco::RAnsBitDecoder,_std::default_delete<draco::RAnsBitDecoder[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_draco::RAnsBitDecoder_*,_std::default_delete<draco::RAnsBitDecoder[]>_>
                         .super__Head_base<0UL,_draco::RAnsBitDecoder_*,_false>._M_head_impl,
                         &this->buffer_);
      if (bVar2) {
        lVar5 = 0;
        lVar6 = 0x18;
        do {
          lVar5 = lVar5 + 1;
          bVar1 = lVar5 < this->num_attribute_data_;
          if (this->num_attribute_data_ <= lVar5) {
            return true;
          }
          bVar2 = RAnsBitDecoder::StartDecoding
                            ((RAnsBitDecoder *)
                             ((long)&(((this->attribute_connectivity_decoders_)._M_t.
                                       super___uniq_ptr_impl<draco::RAnsBitDecoder,_std::default_delete<draco::RAnsBitDecoder[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_draco::RAnsBitDecoder_*,_std::default_delete<draco::RAnsBitDecoder[]>_>
                                       .super__Head_base<0UL,_draco::RAnsBitDecoder_*,_false>.
                                      _M_head_impl)->ans_decoder_).buf + lVar6),&this->buffer_);
          lVar6 = lVar6 + 0x18;
        } while (bVar2);
      }
      if (bVar1) {
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool DecodeAttributeSeams() {
    // Prepare attribute decoding.
    if (num_attribute_data_ > 0) {
      attribute_connectivity_decoders_ = std::unique_ptr<BinaryDecoder[]>(
          new BinaryDecoder[num_attribute_data_]);
      for (int i = 0; i < num_attribute_data_; ++i) {
        if (!attribute_connectivity_decoders_[i].StartDecoding(&buffer_)) {
          return false;
        }
      }
    }
    return true;
  }